

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O3

char * ConvolutionReverb_GetSampleName(int index)

{
  char *pcVar1;
  MutexScopeLock mutexScope;
  MutexScopeLock local_18;
  
  if (index < 0) {
    pcVar1 = "Synthetic";
  }
  else if ((uint)index < 0x10) {
    local_18.mutex = (Mutex *)ConvolutionReverb::sampleMutex;
    Mutex::Lock((Mutex *)ConvolutionReverb::sampleMutex);
    if (ConvolutionReverb::GetIRSample(int)::initialized == '\0') {
      memset(ConvolutionReverb::GetIRSample(int)::samples,0,0x4200);
      ConvolutionReverb::GetIRSample(int)::initialized = '\x01';
    }
    pcVar1 = "Not set";
    if (*(int *)(ConvolutionReverb::GetIRSample(int)::samples + (ulong)(uint)index * 0x420 + 0x18)
        != 0) {
      pcVar1 = ConvolutionReverb::GetIRSample(int)::samples + (ulong)(uint)index * 0x420 + 0x1c;
    }
    MutexScopeLock::~MutexScopeLock(&local_18);
  }
  else {
    pcVar1 = "Not set";
  }
  return pcVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API const char* ConvolutionReverb_GetSampleName(int index)
{
    if (index < 0)
        return "Synthetic";

    if (index < ConvolutionReverb::MAXSAMPLE)
    {
        MutexScopeLock mutexScope(ConvolutionReverb::sampleMutex);
        ConvolutionReverb::IRSample& s = ConvolutionReverb::GetIRSample(index);
        if (!s.allocated)
            return "Not set";
        return s.name;
    }

    return "Not set";
}